

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_pack(char *infits,int *outfits,fitsfile *param_3)

{
  fitsfile *pfVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 auStack_6f8 [213];
  fitsfile *local_50;
  fitsfile *local_48;
  undefined8 *local_40;
  int local_34;
  fitsfile *pfStack_30;
  int stat;
  fitsfile *outfptr;
  fitsfile *infptr;
  int *islossless_local;
  char *outfits_local;
  char *infits_local;
  
  bVar5 = 0;
  local_40 = (undefined8 *)&stack0x00000008;
  local_34 = 0;
  infptr = param_3;
  islossless_local = outfits;
  outfits_local = infits;
  ffopentest(10,&outfptr,infits,0,&local_34);
  if (local_34 == 0) {
    ffinit(&stack0xffffffffffffffd0,islossless_local,&local_34);
    if (local_34 != 0) {
      fp_abort_output(outfptr,(fitsfile *)0x0,local_34);
    }
    if (local_34 != 0) {
      fp_abort_output(outfptr,pfStack_30,local_34);
    }
    while (local_34 == 0) {
      fits_set_lossy_int(pfStack_30,*(undefined4 *)(local_40 + 4),&local_34);
      fits_set_compression_type(pfStack_30,*(undefined4 *)local_40,&local_34);
      fits_set_tile_dim(pfStack_30,6,local_40 + 6,&local_34);
      if (*(int *)(local_40 + 1) == 0) {
        fits_set_quantize_method(pfStack_30,*(undefined4 *)(local_40 + 2),&local_34);
      }
      else {
        fits_set_quantize_method(pfStack_30,0xffffffff,&local_34);
      }
      fits_set_quantize_level(*(undefined4 *)((long)local_40 + 4),pfStack_30,&local_34);
      fits_set_dither_offset(pfStack_30,*(undefined4 *)((long)local_40 + 0xc),&local_34);
      fits_set_hcomp_scale(*(undefined4 *)((long)local_40 + 0x14),pfStack_30,&local_34);
      fits_set_hcomp_smooth(pfStack_30,*(undefined4 *)((long)local_40 + 0x1c),&local_34);
      pfVar1 = infptr;
      local_48 = outfptr;
      local_50 = pfStack_30;
      puVar3 = local_40;
      puVar4 = auStack_6f8;
      for (lVar2 = 0xd5; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      fp_pack_hdu(local_48,local_50,pfVar1,&local_34);
      if (*(int *)((long)local_40 + 0x74) != 0) {
        ffpcks(pfStack_30,&local_34);
      }
      ffmrhd(outfptr,1,0,&local_34);
    }
    if (local_34 == 0x6b) {
      local_34 = 0;
    }
    if (*(int *)((long)local_40 + 0x74) != 0) {
      ffmahd(pfStack_30,1,0,&local_34);
      ffpcks(pfStack_30,&local_34);
    }
    if (local_34 != 0) {
      fp_abort_output(outfptr,pfStack_30,local_34);
    }
    ffclos(pfStack_30,&local_34);
    ffclos(outfptr,&local_34);
    return 0;
  }
  ffrprt(_stderr,local_34);
  exit(local_34);
}

Assistant:

int fp_pack (char *infits, char *outfits, fpstate fpvar, int *islossless)
{
	fitsfile *infptr, *outfptr;
	int	stat=0;

	fits_open_file (&infptr, infits, READONLY, &stat);
	if (stat) { fits_report_error (stderr, stat); exit (stat); }

	fits_create_file (&outfptr, outfits, &stat);
	if (stat) { 
	    fp_abort_output(infptr, NULL, stat);
	}


	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	while (! stat) {

	    /*  LOOP OVER EACH HDU */

	    fits_set_lossy_int (outfptr, fpvar.int_to_float, &stat);
	    fits_set_compression_type (outfptr, fpvar.comptype, &stat);
	    fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

	    if (fpvar.no_dither)
	        fits_set_quantize_method(outfptr, -1, &stat);
	    else
	        fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

	    fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
	    fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
	    fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
	    fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

	    fp_pack_hdu (infptr, outfptr, fpvar, islossless, &stat);

	    if (fpvar.do_checksums) {
	        fits_write_chksum (outfptr, &stat);
	    }

	    fits_movrel_hdu (infptr, 1, NULL, &stat);
	}

	if (stat == END_OF_FILE) stat = 0;

	/* set checksum for case of newly created primary HDU	 */

	if (fpvar.do_checksums) {
	    fits_movabs_hdu (outfptr, 1, NULL, &stat);
	    fits_write_chksum (outfptr, &stat);
	}

	if (stat) { 
	    fp_abort_output(infptr, outfptr, stat);
	}

	fits_close_file (outfptr, &stat);
	fits_close_file (infptr, &stat);

	return(0);
}